

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

clockbounds_t * tchecker::clockbounds::compute_clockbounds(system_t *system)

{
  clockbounds_t *this;
  size_t sVar1;
  size_t sVar2;
  clockbounds_t *clockbounds;
  system_t *system_local;
  
  this = (clockbounds_t *)operator_new(0x40);
  sVar1 = tchecker::system::locs_t::locations_count
                    (&(system->super_system_t).super_system_t.super_locs_t);
  sVar2 = tchecker::system::clocks_t::clocks_count((clocks_t *)system,VK_FLATTENED);
  clockbounds_t::clockbounds_t(this,(loc_id_t)sVar1,(clock_id_t)sVar2);
  compute_clockbounds(system,this);
  return this;
}

Assistant:

tchecker::clockbounds::clockbounds_t * compute_clockbounds(tchecker::ta::system_t const & system)
{
  tchecker::clockbounds::clockbounds_t * clockbounds = nullptr;
  try {
    clockbounds = new tchecker::clockbounds::clockbounds_t{
        static_cast<tchecker::loc_id_t>(system.locations_count()),
        static_cast<tchecker::clock_id_t>(system.clocks_count(tchecker::VK_FLATTENED))};

    tchecker::clockbounds::compute_clockbounds(system, *clockbounds);

    return clockbounds;
  }
  catch (...) {
    delete clockbounds;
    throw;
  }
}